

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase::testGroupStarting(StreamingReporterBase *this,GroupInfo *_groupInfo)

{
  pointer pcVar1;
  undefined1 local_58 [8];
  GroupInfo local_50;
  
  local_50.name._M_dataplus._M_p = (pointer)&local_50.name.field_2;
  pcVar1 = (_groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (_groupInfo->name)._M_string_length);
  local_50.groupIndex = _groupInfo->groupIndex;
  local_50.groupsCounts = _groupInfo->groupsCounts;
  local_58 = (undefined1  [8])&local_50;
  Option<Catch::GroupInfo>::operator=(&this->unusedGroupInfo,(Option<Catch::GroupInfo> *)local_58);
  if ((local_58 != (undefined1  [8])0x0) &&
     (pcVar1 = (((string *)local_58)->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar1 != &((string *)local_58)->field_2)) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& _groupInfo ) {
            unusedGroupInfo = _groupInfo;
        }